

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

void __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl
          (UnorderedElementsAreMatcherImplBase *this,ostream *os)

{
  bool bVar1;
  Flags FVar2;
  size_type sVar3;
  ostream *poVar4;
  const_reference ppMVar5;
  ulong local_50;
  size_t i;
  char *sep;
  Message local_38 [3];
  Message local_20;
  ostream *local_18;
  ostream *os_local;
  UnorderedElementsAreMatcherImplBase *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  FVar2 = match_flags(this);
  if (FVar2 == Superset) {
    std::operator<<(local_18,"no surjection from elements to requirements exists such that:\n");
  }
  else if (FVar2 == Subset) {
    std::operator<<(local_18,"no injection from elements to requirements exists such that:\n");
  }
  else if (FVar2 == ExactMatch) {
    bVar1 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::empty((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                     *)(this + 8));
    if (bVar1) {
      std::operator<<(local_18,"isn\'t empty");
      return;
    }
    sVar3 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    *)(this + 8));
    if (sVar3 == 1) {
      poVar4 = std::operator<<(local_18,"doesn\'t have ");
      Elements((UnorderedElementsAreMatcherImplBase *)&local_20,1);
      poVar4 = testing::operator<<(poVar4,&local_20);
      poVar4 = std::operator<<(poVar4,", or has ");
      Elements((UnorderedElementsAreMatcherImplBase *)local_38,1);
      poVar4 = testing::operator<<(poVar4,local_38);
      std::operator<<(poVar4," that ");
      Message::~Message(local_38);
      Message::~Message(&local_20);
      ppMVar5 = std::
                vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                ::operator[]((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                              *)(this + 8),0);
      (*(*ppMVar5)->_vptr_MatcherDescriberInterface[3])(*ppMVar5,local_18);
      return;
    }
    poVar4 = std::operator<<(local_18,"doesn\'t have ");
    sVar3 = std::
            vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
            ::size((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                    *)(this + 8));
    Elements((UnorderedElementsAreMatcherImplBase *)&sep,sVar3);
    poVar4 = testing::operator<<(poVar4,(Message *)&sep);
    std::operator<<(poVar4,", or there exists no permutation of elements such that:\n");
    Message::~Message((Message *)&sep);
  }
  i = (long)"%s from %s (%s ms total)\n\n" + 0x1a;
  for (local_50 = 0;
      sVar3 = std::
              vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
              ::size((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                      *)(this + 8)), local_50 != sVar3; local_50 = local_50 + 1) {
    std::operator<<(local_18,(char *)i);
    FVar2 = match_flags(this);
    if (FVar2 == ExactMatch) {
      poVar4 = std::operator<<(local_18," - element #");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
      std::operator<<(poVar4," ");
    }
    else {
      std::operator<<(local_18," - an element ");
    }
    ppMVar5 = std::
              vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
              ::operator[]((vector<const_testing::MatcherDescriberInterface_*,_std::allocator<const_testing::MatcherDescriberInterface_*>_>
                            *)(this + 8),local_50);
    (*(*ppMVar5)->_vptr_MatcherDescriberInterface[2])(*ppMVar5,local_18);
    FVar2 = match_flags(this);
    if (FVar2 == ExactMatch) {
      i = (size_t)anon_var_dwarf_7864c;
    }
    else {
      i = (long)"%s from %s (%s ms total)\n\n" + 0x19;
    }
  }
  return;
}

Assistant:

void UnorderedElementsAreMatcherImplBase::DescribeNegationToImpl(
    ::std::ostream* os) const {
  switch (match_flags()) {
    case UnorderedMatcherRequire::ExactMatch:
      if (matcher_describers_.empty()) {
        *os << "isn't empty";
        return;
      }
      if (matcher_describers_.size() == 1) {
        *os << "doesn't have " << Elements(1) << ", or has " << Elements(1)
            << " that ";
        matcher_describers_[0]->DescribeNegationTo(os);
        return;
      }
      *os << "doesn't have " << Elements(matcher_describers_.size())
          << ", or there exists no permutation of elements such that:\n";
      break;
    case UnorderedMatcherRequire::Superset:
      *os << "no surjection from elements to requirements exists such that:\n";
      break;
    case UnorderedMatcherRequire::Subset:
      *os << "no injection from elements to requirements exists such that:\n";
      break;
  }
  const char* sep = "";
  for (size_t i = 0; i != matcher_describers_.size(); ++i) {
    *os << sep;
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      *os << " - element #" << i << " ";
    } else {
      *os << " - an element ";
    }
    matcher_describers_[i]->DescribeTo(os);
    if (match_flags() == UnorderedMatcherRequire::ExactMatch) {
      sep = ", and\n";
    } else {
      sep = "\n";
    }
  }
}